

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O1

int Diffusion::set_rho_flag(DiffusionForm compDiffusionType)

{
  ostringstream *this;
  int iVar1;
  char local_199;
  Print local_198;
  
  if (compDiffusionType < (Laplacian_S|Laplacian_SoverRho)) {
    iVar1 = *(int *)(&DAT_0078caa8 + (ulong)compDiffusionType * 4);
  }
  else {
    local_198.os = amrex::OutStream();
    local_198.rank = *(int *)(DAT_00842950 + -0x30);
    this = &local_198.ss;
    local_198.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    *(undefined8 *)(&local_198.field_0x18 + *(long *)(local_198._16_8_ + -0x18)) =
         *(undefined8 *)(local_198.os + *(long *)(*(long *)local_198.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"compDiffusionType = ",0x14);
    std::ostream::operator<<(this,compDiffusionType);
    local_199 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,&local_199,1);
    amrex::Print::~Print(&local_198);
    amrex::Abort_host("An unknown NavierStokesBase::DiffusionForm was used in set_rho_flag");
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
Diffusion::set_rho_flag(const DiffusionForm compDiffusionType)
{
    int rho_flag = 0;

    switch (compDiffusionType)
    {
        case Laplacian_S:
            rho_flag = 0;
            break;

        case RhoInverse_Laplacian_S:
            rho_flag = 1;
            break;

        case Laplacian_SoverRho:
            rho_flag = 2;
            break;

        //NOTE: rho_flag = 3 is used in a different context for
        //      do_mom_diff==1

        default:
            amrex::Print() << "compDiffusionType = " << compDiffusionType << '\n';
            amrex::Abort("An unknown NavierStokesBase::DiffusionForm was used in set_rho_flag");
    }

    return rho_flag;
}